

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_unexposeRegistry_Test::
~IntegrationTest_unexposeRegistry_Test(IntegrationTest_unexposeRegistry_Test *this)

{
  IntegrationTest_unexposeRegistry_Test *this_local;
  
  ~IntegrationTest_unexposeRegistry_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntegrationTest, unexposeRegistry) {
  const std::string counter_name = "some_counter_total";
  const auto registry =
      RegisterSomeCounter(counter_name, default_metrics_path_);

  exposer_->RemoveCollectable(registry, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, Not(HasSubstr(counter_name)));
}